

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O0

void add(uint *a,uint b,int *retenue,unsigned_long base)

{
  unsigned_long base_local;
  int *retenue_local;
  uint b_local;
  uint *a_local;
  
  if ((ulong)b < base - *a) {
    *a = b + *a;
  }
  else {
    *retenue = 1;
    *a = *a - (int)base;
    *a = b + *a;
  }
  return;
}

Assistant:

void add(unsigned int *a, const unsigned int b, int *retenue, const long unsigned int base) {
    /**
     * Addition avec overflow p/r a la base
     */
    if(base - *a > b) {
        *a += b;
    }
    else{
        *retenue = 1;
        *a -= base;
        *a += b;
    }
}